

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NodeCheckDist1Free(Abc_Obj_t *pNode)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  
  pcVar2 = (char *)(pNode->field_5).pData;
  uVar1 = (pNode->vFanins).nSize;
  uVar3 = 0;
  pcVar4 = pcVar2;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    pcVar5 = pcVar2;
    if (*pcVar4 == '\0') {
      return;
    }
    for (; *pcVar5 != '\0'; pcVar5 = pcVar5 + (long)(int)uVar1 + 3) {
      if (pcVar4 != pcVar5) {
        uVar7 = 0;
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          uVar7 = uVar7 + (pcVar4[uVar6] != pcVar5[uVar6]);
        }
        if (uVar7 < 2) {
          __assert_fail("Counter > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                        ,0x26c,"void Abc_NodeCheckDist1Free(Abc_Obj_t *)");
        }
      }
    }
    pcVar4 = pcVar4 + (long)(int)uVar1 + 3;
  } while( true );
}

Assistant:

void Abc_NodeCheckDist1Free( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2;
    int i, nVars = Abc_ObjFaninNum(pNode);
    Abc_SopForEachCube( pSop, nVars, pCube )
    Abc_SopForEachCube( pSop, nVars, pCube2 )
    {
        int Counter = 0;
        if ( pCube == pCube2 )
            continue;
        for ( i = 0; i < nVars; i++ )
            if ( pCube[i] != pCube2[i] )
                Counter++;
        assert( Counter > 1 );
    }
}